

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

Point2f __thiscall
pbrt::WindowedPiecewiseConstant2D::Sample
          (WindowedPiecewiseConstant2D *this,Point2f *u,Bounds2f *b,Float *pdf)

{
  undefined1 auVar1 [16];
  anon_class_24_3_6b4c7fa8 func;
  anon_class_24_3_3815fa30 func_00;
  int n;
  Float FVar2;
  float fVar3;
  Float FVar4;
  Tuple2<pbrt::Point2,_float> TVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  Float sumby;
  Float sumb;
  Bounds2f by;
  Point2f local_80;
  Float local_78;
  Float local_74;
  WindowedPiecewiseConstant2D *local_70;
  Bounds2f *pBStack_68;
  Float *local_60;
  WindowedPiecewiseConstant2D *local_58;
  Bounds2f *pBStack_50;
  Float *local_48;
  Bounds2f local_40;
  
  FVar2 = SummedAreaTable::Sum(&this->sat,b);
  if ((FVar2 != 0.0) || (NAN(FVar2))) {
    local_74 = SummedAreaTable::Sum(&this->sat,b);
    local_48 = &local_74;
    n = (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
        (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
    func.b = b;
    func.this = this;
    func.sumb = local_48;
    local_58 = this;
    pBStack_50 = b;
    local_80.super_Tuple2<pbrt::Point2,_float>.x =
         sample<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_1_>
                   (func,(u->super_Tuple2<pbrt::Point2,_float>).x,
                    (b->pMin).super_Tuple2<pbrt::Point2,_float>.x,
                    (b->pMax).super_Tuple2<pbrt::Point2,_float>.x,n);
    fVar7 = (float)n;
    fVar3 = local_80.super_Tuple2<pbrt::Point2,_float>.x * fVar7;
    auVar6 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
    auVar1 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),10);
    auVar8._0_4_ = auVar6._0_4_ / fVar7;
    auVar8._4_12_ = auVar6._4_12_;
    auVar6._0_4_ = auVar1._0_4_ / fVar7;
    auVar6._4_12_ = auVar1._4_12_;
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)(b->pMax).super_Tuple2<pbrt::Point2,_float>.y),0x10)
    ;
    auVar1 = vinsertps_avx(auVar8,ZEXT416((uint)(b->pMin).super_Tuple2<pbrt::Point2,_float>.y),0x10)
    ;
    auVar8 = vminps_avx(auVar6,auVar1);
    auVar6 = vmaxps_avx(auVar6,auVar1);
    fVar3 = auVar6._0_4_;
    local_40 = (Bounds2f)vmovlhps_avx(auVar8,auVar6);
    if ((auVar8._0_4_ == fVar3) && (!NAN(auVar8._0_4_) && !NAN(fVar3))) {
      local_40.pMax.super_Tuple2<pbrt::Point2,_float>.x = 1.0 / fVar7 + fVar3;
    }
    FVar2 = SummedAreaTable::Sum(&this->sat,&local_40);
    FVar4 = 0.0;
    TVar5.x = 0.0;
    TVar5.y = 0.0;
    if ((FVar2 != 0.0) || (NAN(FVar2))) {
      local_78 = SummedAreaTable::Sum(&this->sat,&local_40);
      local_60 = &local_78;
      func_00.by = &local_40;
      func_00.this = this;
      func_00.sumby = local_60;
      local_70 = this;
      pBStack_68 = &local_40;
      local_80.super_Tuple2<pbrt::Point2,_float>.y =
           sample<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_2_>
                     (func_00,(u->super_Tuple2<pbrt::Point2,_float>).y,
                      (b->pMin).super_Tuple2<pbrt::Point2,_float>.y,
                      (b->pMax).super_Tuple2<pbrt::Point2,_float>.y,
                      (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                      (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
      FVar4 = PDF(this,&local_80,b);
      TVar5.y = local_80.super_Tuple2<pbrt::Point2,_float>.y;
      TVar5.x = local_80.super_Tuple2<pbrt::Point2,_float>.x;
    }
    *pdf = FVar4;
  }
  else {
    *pdf = 0.0;
    TVar5.x = 0.0;
    TVar5.y = 0.0;
  }
  return (Point2f)TVar5;
}

Assistant:

PBRT_CPU_GPU
    Point2f Sample(const Point2f &u, const Bounds2f &b, Float *pdf) const {
        // Handle zero-valued function for windowed sampling
        if (sat.Sum(b) == 0) {
            *pdf = 0;
            return {};
        }

        // Sample marginal windowed function in the first dimension
        Float sumb = sat.Sum(b);
        auto Px = [&, this](Float x) -> Float {
            Bounds2f bx = b;
            bx.pMax.x = x;
            return sat.Sum(bx) / sumb;
        };
        Point2f p;
        int nx = func.xSize();
        p.x = sample(Px, u[0], b.pMin.x, b.pMax.x, nx);

        // Sample conditional windowed function in the second dimension
        Bounds2f by(Point2f(std::floor(p.x * nx) / nx, b.pMin.y),
                    Point2f(std::ceil(p.x * nx) / nx, b.pMax.y));
        if (by.pMin.x == by.pMax.x)
            by.pMax.x += 1.f / nx;
        if (sat.Sum(by) == 0) {
            // This can happen when we're provided a really narrow initial
            // bounding box
            *pdf = 0;
            return {};
        }
        Float sumby = sat.Sum(by);
        auto Py = [&, this](Float y) -> Float {
            Bounds2f byy = by;
            byy.pMax.y = y;
            return sat.Sum(byy) / sumby;
        };
        p.y = sample(Py, u[1], b.pMin.y, b.pMax.y, func.ySize());

        // Compute PDF and return point sampled from windowed function
        *pdf = PDF(p, b);
        return p;
    }